

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

nghttp2_nv * hd_get_table_entry(nghttp2_hd_context *context,size_t idx)

{
  ulong uVar1;
  nghttp2_hd_entry *pnVar2;
  
  if ((idx != 0) && (uVar1 = idx - 1, uVar1 < (context->hd_table).len + 0x3d)) {
    if (0x3c < uVar1) {
      pnVar2 = hd_ringbuf_get(&context->hd_table,idx - 0x3e);
      return &pnVar2->cnv;
    }
    return &static_table[uVar1].cnv;
  }
  return (nghttp2_nv *)0x0;
}

Assistant:

static const nghttp2_nv *hd_get_table_entry(nghttp2_hd_context *context,
                                            size_t idx) {
  if (idx == 0) {
    return NULL;
  }

  --idx;

  if (!INDEX_RANGE_VALID(context, idx)) {
    return NULL;
  }

  return nghttp2_hd_table_get2(context, idx);
}